

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O2

Ga2_Man_t * Ga2_ManStart(Gia_Man_t *pGia,Abs_Par_t *pPars)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  Ga2_Man_t *p;
  abctime aVar5;
  Vec_Ptr_t *pVVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *p_00;
  Rnm_Man_t *pRVar8;
  int *piVar9;
  uint uVar10;
  Gia_Man_t *pGVar11;
  ulong uVar12;
  
  p = (Ga2_Man_t *)calloc(1,0xe0);
  aVar5 = Abc_Clock();
  p->timeStart = aVar5;
  p->fUseNewLine = 1;
  p->pGia = pGia;
  p->pPars = pPars;
  pGVar11 = pGia;
  iVar4 = Ga2_ManMarkup(pGia,5,pPars->fUseSimple);
  p->nMarked = iVar4;
  pVVar6 = Vec_PtrAlloc((int)pGVar11);
  p->vCnfs = pVVar6;
  pVVar7 = Vec_IntAlloc(0);
  Vec_PtrPush(pVVar6,pVVar7);
  pVVar7 = Vec_IntAlloc(0);
  Vec_PtrPush(pVVar6,pVVar7);
  iVar4 = pGia->nObjs;
  pVVar7 = Vec_IntAlloc(iVar4);
  pVVar7->nSize = iVar4;
  if (pVVar7->pArray != (int *)0x0) {
    memset(pVVar7->pArray,0xff,(long)iVar4 << 2);
  }
  p->vIds = pVVar7;
  pVVar7 = Vec_IntAlloc(0);
  p->vProofIds = pVVar7;
  pVVar7 = Vec_IntAlloc(1000);
  p->vAbs = pVVar7;
  p_00 = Vec_IntAlloc(1000);
  p->vValues = p_00;
  Ga2_ObjSetId(p,pGia->pObjs,0);
  Vec_IntPush(p_00,0);
  Vec_IntPush(pVVar7,0);
  pRVar8 = Rnm_ManStart(pGia);
  p->pRnm = pRVar8;
  pVVar6 = Vec_PtrAlloc((int)pGia);
  p->vId2Lit = pVVar6;
  pVVar7 = Vec_IntAlloc(100);
  p->vLits = pVVar7;
  pVVar7 = Vec_IntAlloc(100);
  p->vIsopMem = pVVar7;
  Cnf_ReadMsops(&p->pSopSizes,&p->pSops);
  uVar10 = 0x3ffff;
  do {
    do {
      uVar1 = uVar10 + 1;
      uVar3 = uVar10 & 1;
      uVar10 = uVar1;
    } while (uVar3 != 0);
    uVar12 = 3;
    do {
      iVar4 = (int)uVar12;
      if (uVar1 < (uint)(iVar4 * iVar4)) {
        p->nTable = uVar1;
        piVar9 = (int *)calloc((long)(int)(uVar1 * 6),4);
        p->pTable = piVar9;
        return p;
      }
      uVar2 = (ulong)uVar1 % uVar12;
      uVar12 = (ulong)(iVar4 + 2);
    } while ((int)uVar2 != 0);
  } while( true );
}

Assistant:

Ga2_Man_t * Ga2_ManStart( Gia_Man_t * pGia, Abs_Par_t * pPars )
{
    Ga2_Man_t * p;
    p = ABC_CALLOC( Ga2_Man_t, 1 );
    p->timeStart = Abc_Clock();
    p->fUseNewLine = 1;
    // user data
    p->pGia      = pGia;
    p->pPars     = pPars;
    // markings 
    p->nMarked   = Ga2_ManMarkup( pGia, 5, pPars->fUseSimple );
    p->vCnfs     = Vec_PtrAlloc( 1000 );
    Vec_PtrPush( p->vCnfs, Vec_IntAlloc(0) );
    Vec_PtrPush( p->vCnfs, Vec_IntAlloc(0) );
    // abstraction
    p->vIds      = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    p->vProofIds = Vec_IntAlloc( 0 );
    p->vAbs      = Vec_IntAlloc( 1000 );
    p->vValues   = Vec_IntAlloc( 1000 );
    // add constant node to abstraction
    Ga2_ObjSetId( p, Gia_ManConst0(pGia), 0 );
    Vec_IntPush( p->vValues, 0 );
    Vec_IntPush( p->vAbs, 0 );
    // refinement
    p->pRnm      = Rnm_ManStart( pGia );
//    p->pRf2      = Rf2_ManStart( pGia );
    // SAT solver and variables
    p->vId2Lit   = Vec_PtrAlloc( 1000 );
    // temporaries
    p->vLits     = Vec_IntAlloc( 100 );
    p->vIsopMem  = Vec_IntAlloc( 100 );
    Cnf_ReadMsops( &p->pSopSizes, &p->pSops );
    // hash table
    p->nTable = Abc_PrimeCudd(1<<18);
    p->pTable = ABC_CALLOC( int, 6 * p->nTable ); 
    return p;
}